

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

void __thiscall
cbtCollisionWorld::updateSingleAabb(cbtCollisionWorld *this,cbtCollisionObject *colObj)

{
  cbtIDebugDraw *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  cbtVector3 maxAabb;
  cbtVector3 minAabb;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  undefined1 local_58 [16];
  undefined8 local_40;
  float local_38;
  float local_34;
  ulong local_30;
  float local_28;
  float local_24;
  
  (*colObj->m_collisionShape->_vptr_cbtCollisionShape[2])
            (colObj->m_collisionShape,&colObj->m_worldTransform,&local_68,&local_78);
  if ((((this->m_dispatchInfo).m_useContinuous == true) && (colObj->m_internalType == 2)) &&
     ((colObj->m_collisionFlags & 3) == 0)) {
    local_58 = ZEXT416((uint)gContactBreakingThreshold);
    (*colObj->m_collisionShape->_vptr_cbtCollisionShape[2])
              (colObj->m_collisionShape,&colObj->m_interpolationWorldTransform,&local_30,&local_40);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_30;
    auVar3._4_4_ = local_58._0_4_;
    auVar3._0_4_ = local_58._0_4_;
    auVar3._8_4_ = local_58._0_4_;
    auVar3._12_4_ = local_58._0_4_;
    auVar2 = vsubps_avx(auVar2,auVar3);
    local_30 = vmovlps_avx(auVar2);
    local_28 = local_28 - (float)local_58._0_4_;
    auVar4._0_4_ = (float)local_58._0_4_ + (float)local_40;
    auVar4._4_4_ = (float)local_58._0_4_ + (float)((ulong)local_40 >> 0x20);
    auVar4._8_4_ = (float)local_58._0_4_ + 0.0;
    auVar4._12_4_ = (float)local_58._0_4_ + 0.0;
    local_40 = vmovlps_avx(auVar4);
    local_38 = (float)local_58._0_4_ + local_38;
    if (auVar2._0_4_ < local_68) {
      local_68 = auVar2._0_4_;
    }
    auVar2 = vmovshdup_avx(auVar2);
    if (auVar2._0_4_ < local_64) {
      local_64 = auVar2._0_4_;
    }
    if (local_28 < local_60) {
      local_60 = local_28;
    }
    if (local_24 < local_5c) {
      local_5c = local_24;
    }
    if (local_78 < auVar4._0_4_) {
      local_78 = auVar4._0_4_;
    }
    auVar2 = vmovshdup_avx(auVar4);
    if (local_74 < auVar2._0_4_) {
      local_74 = auVar2._0_4_;
    }
    if (local_70 < local_38) {
      local_70 = local_38;
    }
    if (local_6c < local_34) {
      local_6c = local_34;
    }
  }
  if ((colObj->m_collisionFlags & 1) == 0) {
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)((local_74 - local_64) * (local_74 - local_64))),
                             ZEXT416((uint)(local_78 - local_68)),
                             ZEXT416((uint)(local_78 - local_68)));
    auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)(local_70 - local_60)),
                             ZEXT416((uint)(local_70 - local_60)));
    if (1e+12 <= auVar2._0_4_) {
      cbtCollisionObject::setActivationState(colObj,5);
      if (updateSingleAabb(cbtCollisionObject*)::reportMe != '\0') {
        return;
      }
      pcVar1 = this->m_debugDrawer;
      if (pcVar1 == (cbtIDebugDraw *)0x0) {
        return;
      }
      updateSingleAabb(cbtCollisionObject*)::reportMe = '\x01';
      (*pcVar1->_vptr_cbtIDebugDraw[0xb])(pcVar1,"Overflow in AABB, object removed from simulation")
      ;
      (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xb])
                (this->m_debugDrawer,
                 "If you can reproduce this, please email bugs@continuousphysics.com\n");
      (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xb])
                (this->m_debugDrawer,
                 "Please include above information, your Platform, version of OS.\n");
      (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xb])(this->m_debugDrawer,"Thanks.\n");
      return;
    }
  }
  (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[4])
            (this->m_broadphasePairCache,colObj->m_broadphaseHandle,&local_68,&local_78,
             this->m_dispatcher1);
  return;
}

Assistant:

void cbtCollisionWorld::updateSingleAabb(cbtCollisionObject* colObj)
{
	cbtVector3 minAabb, maxAabb;
	colObj->getCollisionShape()->getAabb(colObj->getWorldTransform(), minAabb, maxAabb);
	//need to increase the aabb for contact thresholds
	cbtVector3 contactThreshold(gContactBreakingThreshold, gContactBreakingThreshold, gContactBreakingThreshold);
    /* ***CHRONO*** minAabb and maxAabb not needed because the margin in Chrono also icludes the contact braking layer */
	////minAabb -= contactThreshold;
	////maxAabb += contactThreshold;

	if (getDispatchInfo().m_useContinuous && colObj->getInternalType() == cbtCollisionObject::CO_RIGID_BODY && !colObj->isStaticOrKinematicObject())
	{
		cbtVector3 minAabb2, maxAabb2;
		colObj->getCollisionShape()->getAabb(colObj->getInterpolationWorldTransform(), minAabb2, maxAabb2);
		minAabb2 -= contactThreshold;
		maxAabb2 += contactThreshold;
		minAabb.setMin(minAabb2);
		maxAabb.setMax(maxAabb2);
	}

	cbtBroadphaseInterface* bp = (cbtBroadphaseInterface*)m_broadphasePairCache;

	//moving objects should be moderately sized, probably something wrong if not
	if (colObj->isStaticObject() || ((maxAabb - minAabb).length2() < cbtScalar(1e12)))
	{
		bp->setAabb(colObj->getBroadphaseHandle(), minAabb, maxAabb, m_dispatcher1);
	}
	else
	{
		//something went wrong, investigate
		//this assert is unwanted in 3D modelers (danger of loosing work)
		colObj->setActivationState(DISABLE_SIMULATION);

		static bool reportMe = true;
		if (reportMe && m_debugDrawer)
		{
			reportMe = false;
			m_debugDrawer->reportErrorWarning("Overflow in AABB, object removed from simulation");
			m_debugDrawer->reportErrorWarning("If you can reproduce this, please email bugs@continuousphysics.com\n");
			m_debugDrawer->reportErrorWarning("Please include above information, your Platform, version of OS.\n");
			m_debugDrawer->reportErrorWarning("Thanks.\n");
		}
	}
}